

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void (anonymous_namespace)::testDiskAttrValue<Imf_3_2::TypedAttribute<int>>
               (Header *diskHeader,TypedAttribute<int> *testAttribute)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  int *piVar4;
  InputExc *this;
  long *in_RSI;
  string *in_RDI;
  TypedAttribute<int> *diskAttr;
  string *attrName;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  string *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RSI + 0x10))();
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__a);
  std::allocator<char>::~allocator(&local_39);
  local_18 = local_38;
  uVar2 = Imf_3_2::Header::operator[](local_8);
  lVar3 = __dynamic_cast(uVar2,&Imf_3_2::Attribute::typeinfo,&Imf_3_2::TypedAttribute<int>::typeinfo
                         ,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  piVar4 = (int *)Imf_3_2::TypedAttribute<int>::value();
  iVar1 = *piVar4;
  piVar4 = (int *)Imf_3_2::TypedAttribute<int>::value();
  if (iVar1 != *piVar4) {
    this = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(this,"incorrect value from disk");
    __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testDiskAttrValue (const Header& diskHeader, const T& testAttribute)
{
    const string& attrName = testAttribute.typeName ();
    const T&      diskAttr = dynamic_cast<const T&> (diskHeader[attrName]);
    if (diskAttr.value () != testAttribute.value ())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}